

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O2

int PurgeComputerRS232Port(HANDLE hDev)

{
  int iVar1;
  
  iVar1 = tcflush((int)hDev,2);
  return (int)(iVar1 != 0);
}

Assistant:

inline int PurgeComputerRS232Port(HANDLE hDev)
{
#ifdef _WIN32
	if (!PurgeComm(hDev, PURGE_RXCLEAR | PURGE_TXCLEAR))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("PurgeComputerRS232Port error (%s) : %s(hDev=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev));
		return EXIT_FAILURE;
	}
#else 
	if (tcflush((intptr_t)hDev, TCIOFLUSH) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("PurgeComputerRS232Port error (%s) : %s(hDev=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	return EXIT_SUCCESS;
}